

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldResponseNackPdu.cpp
# Opt level: O0

bool __thiscall
DIS::MinefieldResponseNackPdu::operator==
          (MinefieldResponseNackPdu *this,MinefieldResponseNackPdu *rhs)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference rhs_00;
  ulong local_28;
  size_t idx;
  bool ivarsEqual;
  MinefieldResponseNackPdu *rhs_local;
  MinefieldResponseNackPdu *this_local;
  
  idx._7_1_ = MinefieldFamilyPdu::operator==
                        (&this->super_MinefieldFamilyPdu,&rhs->super_MinefieldFamilyPdu);
  bVar1 = EntityID::operator==(&this->_minefieldID,&rhs->_minefieldID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = EntityID::operator==(&this->_requestingEntityID,&rhs->_requestingEntityID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  if (this->_requestID != rhs->_requestID) {
    idx._7_1_ = false;
  }
  local_28 = 0;
  while( true ) {
    sVar2 = std::vector<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>::size
                      (&this->_missingPduSequenceNumbers);
    if (sVar2 <= local_28) break;
    this_00 = std::vector<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>::operator[]
                        (&this->_missingPduSequenceNumbers,local_28);
    rhs_00 = std::vector<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>::operator[]
                       (&rhs->_missingPduSequenceNumbers,local_28);
    bVar1 = EightByteChunk::operator==(this_00,rhs_00);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    local_28 = local_28 + 1;
  }
  return idx._7_1_;
}

Assistant:

bool MinefieldResponseNackPdu::operator ==(const MinefieldResponseNackPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = MinefieldFamilyPdu::operator==(rhs);

     if( ! (_minefieldID == rhs._minefieldID) ) ivarsEqual = false;
     if( ! (_requestingEntityID == rhs._requestingEntityID) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _missingPduSequenceNumbers.size(); idx++)
     {
        if( ! ( _missingPduSequenceNumbers[idx] == rhs._missingPduSequenceNumbers[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }